

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O3

void __thiscall TypeOpNew::TypeOpNew(TypeOpNew *this,TypeFactory *t)

{
  OpBehavior *pOVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"new","");
  TypeOp::TypeOp(&this->super_TypeOp,t,CPUI_NEW,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_TypeOp)._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003c0a50;
  (this->super_TypeOp).opflags = 0x20014;
  pOVar1 = (OpBehavior *)operator_new(0x10);
  pOVar1->_vptr_OpBehavior = (_func_int **)&PTR__OpBehavior_003cb220;
  pOVar1->opcode = CPUI_NEW;
  pOVar1->isunary = false;
  pOVar1->isspecial = true;
  (this->super_TypeOp).behave = pOVar1;
  return;
}

Assistant:

TypeOpNew::TypeOpNew(TypeFactory *t) : TypeOp(t,CPUI_NEW,"new")

{
  opflags = PcodeOp::special | PcodeOp::call | PcodeOp::nocollapse;
  behave = new OpBehavior(CPUI_NEW,false,true);		// Dummy behavior
}